

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkFlow.c
# Opt level: O2

int Nwk_ManPushForwardBot_rec(Nwk_Obj_t *pObj,Nwk_Obj_t *pPred)

{
  Nwk_Obj_t *pObj_00;
  int iVar1;
  long lVar2;
  
  iVar1 = Nwk_ObjVisitedBot(pObj);
  if (iVar1 != 0) {
    return 0;
  }
  Nwk_ObjSetVisitedBot(pObj);
  if ((pObj->field_0x20 & 0x20) == 0) {
    iVar1 = Nwk_ManPushForwardTop_rec(pObj,pObj);
    if (iVar1 != 0) {
      pObj->field_0x20 = pObj->field_0x20 | 0x20;
LAB_00715bcd:
      pObj->pCopy = pPred;
      return 1;
    }
  }
  else {
    pObj_00 = (Nwk_Obj_t *)pObj->pCopy;
    if ((pObj_00 != (Nwk_Obj_t *)0x0) &&
       (iVar1 = Nwk_ManPushForwardTop_rec(pObj_00,pObj_00), iVar1 != 0)) goto LAB_00715bcd;
  }
  lVar2 = 0;
  while( true ) {
    if (pObj->nFanins <= lVar2) {
      return 0;
    }
    if (pObj->pFanio[lVar2] == (Nwk_Obj_t *)0x0) break;
    iVar1 = Nwk_ManPushForwardBot_rec(pObj->pFanio[lVar2],pPred);
    lVar2 = lVar2 + 1;
    if (iVar1 != 0) {
      return 1;
    }
  }
  return 0;
}

Assistant:

int Nwk_ManPushForwardBot_rec( Nwk_Obj_t * pObj, Nwk_Obj_t * pPred )
{
    Nwk_Obj_t * pNext;
    int i;
    if ( Nwk_ObjVisitedBot(pObj) )
        return 0;
    Nwk_ObjSetVisitedBot(pObj);
    // propagate through the internal edge
    if ( Nwk_ObjHasFlow(pObj) )
    {
        if ( Nwk_ObjPred(pObj) )
            if ( Nwk_ManPushForwardTop_rec( Nwk_ObjPred(pObj), Nwk_ObjPred(pObj) ) )
                return Nwk_ObjSetPred( pObj, pPred ); 
    }
    else if ( Nwk_ManPushForwardTop_rec(pObj, pObj) )
    {
        Nwk_ObjSetFlow( pObj );
        return Nwk_ObjSetPred( pObj, pPred );
    }
    // try to push through the fanins
    Nwk_ObjForEachFanin( pObj, pNext, i )
        if ( Nwk_ManPushForwardBot_rec( pNext, pPred ) )
            return 1;
    return 0;
}